

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

QByteArray * QStringAlgorithms<const_QByteArray>::simplified_helper(QByteArray *str)

{
  long lVar1;
  bool bVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  long size;
  qsizetype qVar5;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype newlen;
  bool unmodified;
  Char *ptr;
  Char *dst;
  Char *end;
  Char *src;
  NakedStringType result;
  QByteArray *in_stack_ffffffffffffff58;
  QByteArray *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff76;
  bool bVar7;
  undefined1 uVar8;
  Initialization IVar9;
  QByteArray *size_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *local_50;
  char *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size_00 = in_RDI;
  bVar2 = QByteArray::isEmpty((QByteArray *)0x4bd880);
  IVar9 = (Initialization)((ulong)in_RDI >> 0x20);
  if (bVar2) {
    QByteArray::QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    local_38 = QByteArray::cbegin((QByteArray *)0x4bd8a4);
    pcVar3 = QByteArray::cend((QByteArray *)0x4bd8b3);
    QByteArray::size(in_RSI);
    QByteArray::QByteArray
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (qsizetype)size_00,IVar9);
    pcVar4 = QByteArray::cbegin((QByteArray *)0x4bd936);
    bVar2 = true;
    local_50 = pcVar4;
    while( true ) {
      while( true ) {
        bVar7 = false;
        if (local_38 != pcVar3) {
          in_stack_ffffffffffffff76 = isSpace('\0');
          bVar7 = (bool)in_stack_ffffffffffffff76;
        }
        if (bVar7 == false) break;
        local_38 = local_38 + 1;
      }
      uVar8 = 0;
      while( true ) {
        bVar6 = 0;
        if (local_38 != pcVar3) {
          in_stack_ffffffffffffff74 = isSpace('\0');
          bVar6 = in_stack_ffffffffffffff74 ^ 0xff;
        }
        if ((bVar6 & 1) == 0) break;
        *local_50 = *local_38;
        local_50 = local_50 + 1;
        local_38 = local_38 + 1;
      }
      if (local_38 == pcVar3) break;
      if (*local_38 != ' ') {
        bVar2 = false;
      }
      *local_50 = ' ';
      local_50 = local_50 + 1;
    }
    if ((local_50 != pcVar4) && (local_50[-1] == ' ')) {
      local_50 = local_50 + -1;
    }
    size = (long)local_50 - (long)pcVar4;
    qVar5 = QByteArray::size(in_RSI);
    if ((size == qVar5) && (bVar2)) {
      QByteArray::QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      QByteArray::resize((QByteArray *)
                         CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffff76,
                                                 CONCAT15(bVar6,CONCAT14(in_stack_ffffffffffffff74,
                                                                         in_stack_ffffffffffffff70))
                                                )),size);
      QByteArray::QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    QByteArray::~QByteArray((QByteArray *)0x4bdb0d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return size_00;
  }
  __stack_chk_fail();
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }